

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O3

void mxx::impl::all2allv_big<int>
               (int *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *send_displs,int *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_displs,comm *comm)

{
  uint uVar1;
  unsigned_long uVar2;
  MPI_Comm poVar3;
  MPI_Datatype poVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  requests reqs;
  datatype dt;
  datatype local_b8;
  int local_9c;
  undefined1 local_98 [8];
  pointer local_90;
  pointer ppoStack_88;
  pointer local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_78;
  datatype local_70;
  int *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_48;
  int *local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  uVar5 = (ulong)((long)(send_sizes->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(send_sizes->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  local_78 = recv_sizes;
  local_58 = msgs;
  local_50 = send_displs;
  local_48 = send_sizes;
  local_40 = out;
  local_38 = recv_displs;
  if (comm->m_size != (int)uVar5) {
    MPI_Comm_rank(&ompi_mpi_comm_world,local_98);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_98 & 0xffffffff,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/big_collective.hpp"
           ,0x131,"all2allv_big","static_cast<int>(send_sizes.size()) == comm.size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    uVar5 = (ulong)(uint)comm->m_size;
  }
  if ((int)uVar5 !=
      (int)((ulong)((long)(local_78->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(local_78->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,local_98);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_98 & 0xffffffff,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/big_collective.hpp"
           ,0x132,"all2allv_big","static_cast<int>(recv_sizes.size()) == comm.size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    uVar5 = (ulong)(uint)comm->m_size;
  }
  local_98 = (undefined1  [8])&PTR__requests_0017fcb0;
  local_90 = (pointer)0x0;
  ppoStack_88 = (pointer)0x0;
  local_80 = (pointer)0x0;
  if (0 < (int)uVar5) {
    iVar7 = 0;
    iVar8 = 0;
    do {
      uVar5 = (long)(comm->m_rank + (int)uVar5 + iVar7) % (long)(int)uVar5;
      iVar6 = (int)uVar5;
      local_b8._vptr_datatype = (_func_int **)&PTR__datatype_0017fc80;
      local_b8.mpitype = (MPI_Datatype)&ompi_mpi_int;
      local_b8.builtin = true;
      local_9c = iVar7;
      datatype::contiguous
                (&local_70,&local_b8,
                 (local_78->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[iVar6]);
      datatype::~datatype(&local_b8);
      poVar4 = local_70.mpitype;
      uVar2 = (local_38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar6];
      poVar3 = comm->mpi_comm;
      local_b8._vptr_datatype = (_func_int **)0x0;
      std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*>
                ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&local_90,
                 (ompi_request_t **)&local_b8);
      MPI_Irecv(local_40 + uVar2,1,poVar4,uVar5 & 0xffffffff,0x3039,poVar3,ppoStack_88 + -1);
      datatype::~datatype(&local_70);
      iVar8 = iVar8 + 1;
      uVar1 = comm->m_size;
      uVar5 = (ulong)uVar1;
      iVar7 = local_9c + -1;
    } while (iVar8 < (int)uVar1);
    if (0 < (int)uVar1) {
      iVar7 = 0;
      do {
        uVar5 = (long)(comm->m_rank + iVar7) % (long)(int)uVar5;
        iVar8 = (int)uVar5;
        local_b8._vptr_datatype = (_func_int **)&PTR__datatype_0017fc80;
        local_b8.mpitype = (MPI_Datatype)&ompi_mpi_int;
        local_b8.builtin = true;
        datatype::contiguous
                  (&local_70,&local_b8,
                   (local_48->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[iVar8]);
        datatype::~datatype(&local_b8);
        poVar4 = local_70.mpitype;
        uVar2 = (local_50->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start[iVar8];
        poVar3 = comm->mpi_comm;
        local_b8._vptr_datatype = (_func_int **)0x0;
        std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*>
                  ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&local_90,
                   (ompi_request_t **)&local_b8);
        MPI_Isend(local_58 + uVar2,1,poVar4,uVar5 & 0xffffffff,0x3039,poVar3,ppoStack_88 + -1);
        datatype::~datatype(&local_70);
        iVar7 = iVar7 + 1;
        uVar5 = (ulong)(uint)comm->m_size;
      } while (iVar7 < comm->m_size);
    }
  }
  MPI_Waitall((ulong)((long)ppoStack_88 - (long)local_90) >> 3,local_90,0);
  requests::~requests((requests *)local_98);
  return;
}

Assistant:

void all2allv_big(const T* msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& send_displs, T* out, const std::vector<size_t>& recv_sizes, const std::vector<size_t>& recv_displs, const mxx::comm& comm = mxx::comm()) {
    // point-to-point implementation
    // TODO: implement MPI_Alltoallw variant
    // TODO: try RMA
    MXX_ASSERT(static_cast<int>(send_sizes.size()) == comm.size());
    MXX_ASSERT(static_cast<int>(recv_sizes.size()) == comm.size());
    // TODO: unify tag usage
    int tag = 12345;
    // implementing this using point-to-point communication!
    // dispatch receives
    mxx::requests reqs;
    for (int i = 0; i < comm.size(); ++i) {
        // start with self send/recv
        int recv_from = (comm.rank() + (comm.size()-i)) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[recv_from]);
        MPI_Irecv(const_cast<T*>(&(*out)) + recv_displs[recv_from], 1, dt.type(),
                  recv_from, tag, comm, &reqs.add());
    }
    // dispatch sends
    for (int i = 0; i < comm.size(); ++i) {
        int send_to = (comm.rank() + i) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(send_sizes[send_to]);
        MPI_Isend(const_cast<T*>(msgs)+send_displs[send_to], 1, dt.type(), send_to,
                  tag, comm, &reqs.add());
    }

    reqs.wait();
}